

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O1

tsize_t __thiscall
TIFFImageHandler::SampleABGRToRGB(TIFFImageHandler *this,tdata_t inData,uint32_t inSampleCount)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  
  if (inSampleCount != 0) {
    uVar2 = 0;
    puVar3 = (undefined4 *)inData;
    do {
      uVar1 = *puVar3;
      *(char *)((long)inData + (uVar2 & 0xffffffff)) = (char)uVar1;
      *(char *)((long)inData + (ulong)((int)uVar2 + 1)) = (char)((uint)uVar1 >> 8);
      *(char *)((long)inData + (ulong)((int)uVar2 + 2)) = (char)((uint)uVar1 >> 0x10);
      uVar2 = uVar2 + 3;
      puVar3 = puVar3 + 1;
    } while ((ulong)inSampleCount * 3 != uVar2);
    return uVar2 & 0xffffffff;
  }
  return 0;
}

Assistant:

tsize_t TIFFImageHandler::SampleABGRToRGB(tdata_t inData, uint32_t inSampleCount)
{
	uint32_t i=0;
	uint32_t sample=0;
	
	for(i=0;i<inSampleCount;i++)
	{
		sample=((uint32_t*)inData)[i];
		((char*)inData)[i*3]= (char) (sample & 0xff);
		((char*)inData)[i*3+1]= (char) ((sample>>8) & 0xff);
		((char*)inData)[i*3+2]= (char) ((sample>>16) & 0xff);
	}

	return(i*3);	
}